

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  undefined1 auVar23 [16];
  bool bVar24;
  int iVar25;
  int iVar26;
  pointer pnVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  cpp_dec_float<50U,_int,_void> *pcVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  byte bVar34;
  Real a;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  cpp_dec_float<50U,_int,_void> local_308;
  long local_2d0;
  cpp_dec_float<50U,_int,_void> local_2c8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_290;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_288;
  int local_27c;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  undefined1 local_1f8 [16];
  uint local_1e8 [3];
  undefined3 uStack_1db;
  uint local_1d8 [3];
  bool local_1cc;
  ulong local_1c8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  long local_178;
  undefined8 uStack_170;
  int32_t local_15c;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  undefined1 local_d8 [16];
  uint local_c8 [3];
  undefined3 uStack_bb;
  uint local_b8 [3];
  bool local_ac;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_290 = base;
  local_288 = this;
  if (this->state == DVEC) {
    iVar26 = (int)((long)(this->vec).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->vec).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    if ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum != iVar26) goto LAB_00344814;
    local_2c8.fpclass = cpp_dec_float_finite;
    local_2c8.prec_elem = 10;
    local_2c8.data._M_elems[0] = 0;
    local_2c8.data._M_elems[1] = 0;
    local_2c8.data._M_elems[2] = 0;
    local_2c8.data._M_elems[3] = 0;
    local_2c8.data._M_elems[4] = 0;
    local_2c8.data._M_elems[5] = 0;
    local_2c8.data._M_elems._24_5_ = 0;
    local_2c8.data._M_elems[7]._1_3_ = 0;
    local_2c8.data._M_elems._32_5_ = 0;
    local_2c8.data._M_elems[9]._1_3_ = 0;
    local_2c8.exp = 0;
    local_2c8.neg = false;
    local_158.fpclass = cpp_dec_float_finite;
    local_158.prec_elem = 10;
    local_158.data._M_elems[0] = 0;
    local_158.data._M_elems[1] = 0;
    local_158.data._M_elems[2] = 0;
    local_158.data._M_elems[3] = 0;
    local_158.data._M_elems[4] = 0;
    local_158.data._M_elems[5] = 0;
    local_158.data._M_elems._24_5_ = 0;
    local_158.data._M_elems[7]._1_3_ = 0;
    local_158.data._M_elems._32_5_ = 0;
    local_158.data._M_elems[9]._1_3_ = 0;
    local_158.exp = 0;
    local_158.neg = false;
    local_1c8 = 0xa00000000;
    local_1f8 = (undefined1  [16])0x0;
    local_1e8[0] = 0;
    local_1e8[1] = 0;
    stack0xfffffffffffffe20 = 0;
    uStack_1db = 0;
    local_1d8[0] = 0;
    local_1d8[1] = 0;
    local_1d8[2] = 0;
    local_1cc = false;
    if (iVar26 != 0) {
      lVar30 = (long)iVar26;
      lVar29 = lVar30 * 0x38;
      do {
        pSVar20 = local_288;
        pnVar27 = (this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_308.exp = *(int *)((long)&pnVar27[-1].m_backend.data + lVar29 + 0x28);
        local_308.neg = *(bool *)((long)&pnVar27[-1].m_backend.data + lVar29 + 0x2c);
        local_308._48_8_ = *(undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar29 + 0x30);
        puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar29);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar29 + 0x10);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        uVar3 = *(undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar29 + 0x20);
        local_308.data._M_elems[8] = (uint)uVar3;
        local_308.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
        local_308.data._M_elems[4] = (uint)uVar8;
        local_308.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
        local_308.data._M_elems[6] = (uint)uVar9;
        local_308.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
        local_308.data._M_elems[0] = (uint)uVar6;
        local_308.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
        local_308.data._M_elems[2] = (uint)uVar7;
        local_308.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
        if ((local_308.neg == true) &&
           (local_308.fpclass != cpp_dec_float_finite || local_308.data._M_elems[0] != 0)) {
          local_308.neg = false;
        }
        lVar30 = lVar30 + -1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)&(local_288->
                           super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).rowWeight.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar29),
                   &local_308);
        this = pSVar20;
        lVar29 = lVar29 + -0x38;
      } while (lVar30 != 0);
    }
    lVar29 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar29 != 0) {
      do {
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar26 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar29 + -1].idx;
        local_2d0 = lVar29;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)local_1f8,0);
        local_158.data._M_elems[0] = local_1f8._0_4_;
        local_158.data._M_elems[1] = local_1f8._4_4_;
        local_158.data._M_elems[2] = local_1f8._8_4_;
        local_158.data._M_elems[3] = local_1f8._12_4_;
        local_158.data._M_elems[4] = local_1e8[0];
        local_158.data._M_elems[5] = local_1e8[1];
        local_158.data._M_elems._24_5_ = stack0xfffffffffffffe20;
        local_158.data._M_elems[7]._1_3_ = uStack_1db;
        local_158.data._M_elems._32_5_ = SUB85(local_1d8._0_8_,0);
        local_158.data._M_elems[9]._1_3_ = SUB83(local_1d8._0_8_,5);
        local_158.exp = local_1d8[2];
        local_158.neg = local_1cc;
        local_158.fpclass = (undefined4)local_1c8;
        local_158.prec_elem = local_1c8._4_4_;
        lVar29 = (long)pIVar4[iVar26].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        uVar31 = local_1c8;
        if (lVar29 != 0) {
          pIVar4 = pIVar4 + iVar26;
          lVar30 = lVar29 * 0x3c;
          do {
            pNVar5 = (pIVar4->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            uVar3 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar30 + -0x1c);
            local_2c8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            puVar2 = (uint *)((long)&pNVar5[-1].val.m_backend.data + lVar30);
            local_2c8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_2c8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar30 + -0x2c);
            local_2c8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar3 = *(undefined8 *)(puVar2 + 2);
            local_2c8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_2c8.exp = *(int *)((long)&(pNVar5->val).m_backend.data + lVar30 + -0x14);
            local_2c8.neg = *(bool *)((long)&(pNVar5->val).m_backend.data + lVar30 + -0x10);
            local_2c8._48_8_ = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar30 + -0xc);
            pnVar27 = (local_288->vec).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(int *)((long)&(((pIVar4->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val).m_backend.data + lVar30 + -4);
            local_308.fpclass = cpp_dec_float_finite;
            local_308.prec_elem = 10;
            local_308.data._M_elems[0] = 0;
            local_308.data._M_elems[1] = 0;
            local_308.data._M_elems[2] = 0;
            local_308.data._M_elems[3] = 0;
            local_308.data._M_elems[4] = 0;
            local_308.data._M_elems[5] = 0;
            local_308.data._M_elems[6] = 0;
            local_308.data._M_elems[7] = 0;
            local_308.data._M_elems[8] = 0;
            local_308.data._M_elems[9] = 0;
            local_308.exp = 0;
            local_308.neg = false;
            if (&local_308 != &pnVar27->m_backend) {
              uVar3 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x20);
              local_308.data._M_elems[8] = (uint)uVar3;
              local_308.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
              uVar3 = *(undefined8 *)&(pnVar27->m_backend).data;
              uVar6 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 8);
              uVar7 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x10);
              uVar8 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x18);
              local_308.data._M_elems[4] = (uint)uVar7;
              local_308.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
              local_308.data._M_elems[6] = (uint)uVar8;
              local_308.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
              local_308.data._M_elems[0] = (uint)uVar3;
              local_308.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
              local_308.data._M_elems[2] = (uint)uVar6;
              local_308.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
              local_308.exp = (pnVar27->m_backend).exp;
              local_308.neg = (pnVar27->m_backend).neg;
              local_308.fpclass = (pnVar27->m_backend).fpclass;
              local_308.prec_elem = (pnVar27->m_backend).prec_elem;
            }
            lVar29 = lVar29 + -1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_308,&local_2c8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_158,&local_308);
            local_308.data._M_elems[8] = local_2c8.data._M_elems[8];
            local_308.data._M_elems[9] =
                 (uint)(CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_) >>
                       0x20);
            local_308.data._M_elems[4] = local_2c8.data._M_elems[4];
            local_308.data._M_elems[5] = local_2c8.data._M_elems[5];
            local_308.data._M_elems[6] = local_2c8.data._M_elems[6];
            local_308.data._M_elems[7] =
                 (uint)(CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_) >>
                       0x20);
            local_308.data._M_elems[0] = local_2c8.data._M_elems[0];
            local_308.data._M_elems[1] = local_2c8.data._M_elems[1];
            local_308.data._M_elems[2] = local_2c8.data._M_elems[2];
            local_308.data._M_elems[3] = local_2c8.data._M_elems[3];
            local_308.exp = local_2c8.exp;
            local_308.neg = local_2c8.neg;
            local_308.fpclass = local_2c8.fpclass;
            local_308.prec_elem = local_2c8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_308,&local_2c8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)local_1f8,&local_308);
            lVar30 = lVar30 + -0x3c;
          } while (lVar29 != 0);
          uVar31 = local_1c8 & 0xffffffff;
        }
        base = local_290;
        lVar29 = local_2d0 + -1;
        if ((int)uVar31 != 2) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_308,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_1f8,&local_308);
          if (0 < iVar26) {
            local_238.fpclass = cpp_dec_float_finite;
            local_238.prec_elem = 10;
            local_238.data._M_elems[0] = 0;
            local_238.data._M_elems[1] = 0;
            local_238.data._M_elems[2] = 0;
            local_238.data._M_elems[3] = 0;
            local_238.data._M_elems[4] = 0;
            local_238.data._M_elems[5] = 0;
            local_238.data._M_elems[6] = 0;
            local_238.data._M_elems[7] = 0;
            local_238.data._M_elems[8] = 0;
            local_238.data._M_elems[9] = 0;
            local_238.exp = 0;
            local_238.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_238,&local_158,(cpp_dec_float<50U,_int,_void> *)local_1f8);
            local_178 = lVar29 * 0x38;
            pcVar33 = &(base->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].m_backend;
            local_a8._0_4_ = cpp_dec_float_finite;
            local_a8._4_4_ = 10;
            local_d8 = (undefined1  [16])0x0;
            local_c8[0] = 0;
            local_c8[1] = 0;
            stack0xffffffffffffff40 = 0;
            uStack_bb = 0;
            local_b8[0] = 0;
            local_b8[1] = 0;
            local_b8[2] = 0;
            local_ac = false;
            local_2d0 = lVar29;
            if ((cpp_dec_float<50U,_int,_void> *)local_d8 == pcVar33) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_d8,&local_238);
              if (local_d8._0_4_ == 0 && (fpclass_type)local_a8 == cpp_dec_float_finite) {
                local_308.fpclass = cpp_dec_float_finite;
              }
              else {
                local_ac = (bool)(local_ac ^ 1);
                local_308.fpclass = (fpclass_type)local_a8;
              }
            }
            else {
              local_b8[1] = local_238.data._M_elems[9];
              local_b8[0] = local_238.data._M_elems[8];
              local_d8._4_4_ = local_238.data._M_elems[1];
              local_d8._0_4_ = local_238.data._M_elems[0];
              local_d8._12_4_ = local_238.data._M_elems[3];
              local_d8._8_4_ = local_238.data._M_elems[2];
              local_c8[1] = local_238.data._M_elems[5];
              local_c8[0] = local_238.data._M_elems[4];
              stack0xffffffffffffff40 =
                   (undefined5)CONCAT44(local_238.data._M_elems[7],local_238.data._M_elems[6]);
              uStack_bb = (undefined3)(local_238.data._M_elems[7] >> 8);
              local_b8[2] = local_238.exp;
              local_ac = local_238.neg;
              local_a8._0_4_ = local_238.fpclass;
              local_a8._4_4_ = local_238.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_d8,pcVar33);
              local_308.fpclass = (fpclass_type)local_a8;
            }
            lVar29 = local_2d0;
            local_308.data._M_elems[8] = (uint)local_b8._0_8_;
            local_308.data._M_elems[9] = SUB84(local_b8._0_8_,4);
            local_308.data._M_elems[4] = (uint)local_c8._0_8_;
            local_308.data._M_elems[5] = SUB84(local_c8._0_8_,4);
            local_308.data._M_elems[6] = (uint)stack0xffffffffffffff40;
            local_308.data._M_elems[7] = (uint)(CONCAT35(uStack_bb,stack0xffffffffffffff40) >> 0x20)
            ;
            local_308.data._M_elems[0] = local_d8._0_4_;
            local_308.data._M_elems[1] = local_d8._4_4_;
            local_308.data._M_elems[2] = local_d8._8_4_;
            local_308.data._M_elems[3] = local_d8._12_4_;
            local_308.exp = local_b8[2];
            local_308.prec_elem = local_a8._4_4_;
            local_308.neg = local_ac;
            if (((local_ac & 1U) != 0) &&
               (local_308.fpclass != cpp_dec_float_finite || local_308.data._M_elems[0] != 0)) {
              local_308.neg = (bool)(local_ac ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)&(((local_288->
                                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).colWeight.data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       local_178),&local_308);
          }
        }
      } while (lVar29 != 0);
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)((ulong)((long)(this->vec).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vec).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)) {
LAB_00344814:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    a = Tolerances::epsilon((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_158.fpclass = cpp_dec_float_finite;
    local_158.prec_elem = 10;
    local_158.data._M_elems._0_16_ = ZEXT816(0);
    local_158.data._M_elems[4] = 0;
    local_158.data._M_elems[5] = 0;
    local_158.data._M_elems._24_5_ = 0;
    local_158.data._M_elems[7]._1_3_ = 0;
    local_158.data._M_elems._32_5_ = 0;
    local_158.data._M_elems[9]._1_3_ = 0;
    local_158.exp = 0;
    local_158.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_158,a);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_308,10000,(type *)0x0);
    local_1d8[1]._1_3_ = local_158.data._M_elems[9]._1_3_;
    local_1d8._0_5_ = local_158.data._M_elems._32_5_;
    local_1e8[0] = local_158.data._M_elems[4];
    local_1e8[1] = local_158.data._M_elems[5];
    stack0xfffffffffffffe20 = local_158.data._M_elems._24_5_;
    uStack_1db = local_158.data._M_elems[7]._1_3_;
    local_1f8._0_4_ = local_158.data._M_elems[0];
    local_1f8._4_4_ = local_158.data._M_elems[1];
    local_1f8._8_4_ = local_158.data._M_elems[2];
    local_1f8._12_4_ = local_158.data._M_elems[3];
    local_1d8[2] = local_158.exp;
    local_1cc = local_158.neg;
    local_1c8._0_4_ = local_158.fpclass;
    local_1c8._4_4_ = local_158.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              ((cpp_dec_float<50U,_int,_void> *)local_1f8,&local_308);
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 10;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems[8] = 0;
    local_238.data._M_elems[9] = 0;
    local_238.exp = 0;
    local_238.neg = false;
    local_278.fpclass = cpp_dec_float_finite;
    local_278.prec_elem = 10;
    local_278.data._M_elems[0] = 0;
    local_278.data._M_elems[1] = 0;
    local_278.data._M_elems[2] = 0;
    local_278.data._M_elems[3] = 0;
    local_278.data._M_elems[4] = 0;
    local_278.data._M_elems[5] = 0;
    local_278.data._M_elems[6] = 0;
    local_278.data._M_elems[7] = 0;
    local_278.data._M_elems[8] = 0;
    local_278.data._M_elems[9] = 0;
    local_278.exp = 0;
    local_278.neg = false;
    lVar29 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar29 != 0) {
      lVar30 = lVar29 * 0x38;
      do {
        pnVar27 = (this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar33 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar27[-1].m_backend.data + lVar30);
        pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar30);
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.exp = 0;
        local_308.neg = false;
        if (pcVar28 == &local_308) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,pcVar33);
          if (local_308.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite) {
            local_308.neg = (bool)(local_308.neg ^ 1);
          }
        }
        else {
          if (pcVar33 != &local_308) {
            uVar3 = *(undefined8 *)((pcVar33->data)._M_elems + 8);
            local_308.data._M_elems[8] = (uint)uVar3;
            local_308.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
            uVar3 = *(undefined8 *)(pcVar33->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar33->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar33->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar33->data)._M_elems + 6);
            local_308.data._M_elems[4] = (uint)uVar7;
            local_308.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_308.data._M_elems[6] = (uint)uVar8;
            local_308.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_308.data._M_elems[0] = (uint)uVar3;
            local_308.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_308.data._M_elems[2] = (uint)uVar6;
            local_308.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_308.exp = *(int *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x28);
            local_308.neg = *(bool *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x2c);
            local_308._48_8_ = *(long *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,pcVar28);
        }
        local_238.data._M_elems[8] = local_308.data._M_elems[8];
        local_238.data._M_elems[9] = local_308.data._M_elems[9];
        local_238.data._M_elems[4] = local_308.data._M_elems[4];
        local_238.data._M_elems[5] = local_308.data._M_elems[5];
        local_238.data._M_elems[6] = local_308.data._M_elems[6];
        local_238.data._M_elems[7] = local_308.data._M_elems[7];
        local_238.data._M_elems[0] = local_308.data._M_elems[0];
        local_238.data._M_elems[1] = local_308.data._M_elems[1];
        local_238.data._M_elems[2] = local_308.data._M_elems[2];
        local_238.data._M_elems[3] = local_308.data._M_elems[3];
        local_238.exp = local_308.exp;
        local_238.neg = local_308.neg;
        local_238.fpclass = local_308.fpclass;
        local_238.prec_elem = local_308.prec_elem;
        pnVar27 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar33 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar27[-1].m_backend.data + lVar30);
        pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(this->vec).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar30);
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.exp = 0;
        local_308.neg = false;
        local_2d0 = lVar29;
        if (pcVar28 == &local_308) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,pcVar33);
          if (local_308.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite) {
            local_308.neg = (bool)(local_308.neg ^ 1);
          }
        }
        else {
          if (pcVar33 != &local_308) {
            uVar3 = *(undefined8 *)((pcVar33->data)._M_elems + 8);
            local_308.data._M_elems[8] = (uint)uVar3;
            local_308.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
            uVar3 = *(undefined8 *)(pcVar33->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar33->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar33->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar33->data)._M_elems + 6);
            local_308.data._M_elems[4] = (uint)uVar7;
            local_308.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_308.data._M_elems[6] = (uint)uVar8;
            local_308.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_308.data._M_elems[0] = (uint)uVar3;
            local_308.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_308.data._M_elems[2] = (uint)uVar6;
            local_308.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_308.exp = *(int *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x28);
            local_308.neg = *(bool *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x2c);
            local_308._48_8_ = *(undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,pcVar28);
        }
        local_278.data._M_elems[8] = local_308.data._M_elems[8];
        local_278.data._M_elems[9] = local_308.data._M_elems[9];
        local_278.data._M_elems[4] = local_308.data._M_elems[4];
        local_278.data._M_elems[5] = local_308.data._M_elems[5];
        local_278.data._M_elems[6] = local_308.data._M_elems[6];
        local_278.data._M_elems[7] = local_308.data._M_elems[7];
        local_278.data._M_elems[0] = local_308.data._M_elems[0];
        local_278.data._M_elems[1] = local_308.data._M_elems[1];
        local_278.data._M_elems[2] = local_308.data._M_elems[2];
        local_278.data._M_elems[3] = local_308.data._M_elems[3];
        local_278.exp = local_308.exp;
        local_278.neg = local_308.neg;
        local_278.fpclass = local_308.fpclass;
        local_278.prec_elem = local_308.prec_elem;
        if ((local_308.fpclass == cpp_dec_float_NaN || local_238.fpclass == cpp_dec_float_NaN) ||
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_238,&local_278), iVar26 = local_238.exp,
           uVar10 = local_238.data._M_elems[0], -1 < iVar25)) {
          iVar22 = local_278.prec_elem;
          fVar21 = local_278.fpclass;
          uVar10 = local_278.data._M_elems[0];
          local_178 = CONCAT44(local_178._4_4_,local_278.exp);
          local_1b8.data._M_elems[0] = local_278.data._M_elems[1];
          local_1b8.data._M_elems[1] = local_278.data._M_elems[2];
          local_1b8.data._M_elems[2] = local_278.data._M_elems[3];
          local_1b8.data._M_elems[3] = local_278.data._M_elems[4];
          local_1b8.data._M_elems[4] = local_278.data._M_elems[5];
          local_1b8.data._M_elems[5] = local_278.data._M_elems[6];
          local_1b8.data._M_elems[6] = local_278.data._M_elems[7];
          local_1b8.data._M_elems[7] = local_278.data._M_elems[8];
          local_1b8.data._M_elems[8] = local_278.data._M_elems[9];
          pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(local_290->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar30);
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.data._M_elems._0_16_ = ZEXT816(0);
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.exp = 0;
          local_2c8.neg = false;
          pcVar33 = (cpp_dec_float<50U,_int,_void> *)local_1f8;
          if (pcVar28 != &local_2c8) {
            local_2c8.data._M_elems._32_5_ = SUB85(local_1d8._0_8_,0);
            local_2c8.data._M_elems[9]._1_3_ = SUB83(local_1d8._0_8_,5);
            local_2c8.data._M_elems[4] = local_1e8[0];
            local_2c8.data._M_elems[5] = local_1e8[1];
            local_2c8.data._M_elems._24_5_ = stack0xfffffffffffffe20;
            local_2c8.data._M_elems[7]._1_3_ = uStack_1db;
            local_2c8.data._M_elems[0] = local_1f8._0_4_;
            local_2c8.data._M_elems[1] = local_1f8._4_4_;
            local_2c8.data._M_elems[2] = local_1f8._8_4_;
            local_2c8.data._M_elems[3] = local_1f8._12_4_;
            local_2c8.exp = local_1d8[2];
            local_2c8.neg = local_1cc;
            local_2c8.fpclass = (undefined4)local_1c8;
            local_2c8.prec_elem = local_1c8._4_4_;
            pcVar33 = pcVar28;
          }
          bVar34 = local_278.neg ^
                   (local_278.fpclass != cpp_dec_float_finite || local_278.data._M_elems[0] != 0);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_2c8,pcVar33);
          local_308.data._M_elems[0] = uVar10;
          local_308.data._M_elems[1] = local_1b8.data._M_elems[0];
          local_308.data._M_elems[2] = local_1b8.data._M_elems[1];
          local_308.data._M_elems[3] = local_1b8.data._M_elems[2];
          local_308.data._M_elems[4] = local_1b8.data._M_elems[3];
          local_308.data._M_elems[5] = local_1b8.data._M_elems[4];
          local_308.data._M_elems[6] = local_1b8.data._M_elems[5];
          local_308.data._M_elems[7] = local_1b8.data._M_elems[6];
          local_308.data._M_elems[8] = local_1b8.data._M_elems[7];
          local_308.data._M_elems[9] = local_1b8.data._M_elems[8];
          local_308.exp = (int)local_178;
          local_308.prec_elem = iVar22;
          local_308.fpclass = fVar21;
          local_308.neg = (bool)bVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_308,&local_2c8);
          pnVar27 = (local_288->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30);
          *puVar1 = CONCAT44(local_308.data._M_elems[1],local_308.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[3],local_308.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x10);
          *puVar1 = CONCAT44(local_308.data._M_elems[5],local_308.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[7],local_308.data._M_elems[6]);
          *(ulong *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x20) =
               CONCAT44(local_308.data._M_elems[9],local_308.data._M_elems[8]);
          *(int *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x28) = local_308.exp;
          *(bool *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x2c) = local_308.neg;
          *(undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x30) = local_308._48_8_;
          bVar24 = true;
          this = local_288;
        }
        else {
          local_1b8.data._M_elems[0] = local_238.data._M_elems[1];
          local_1b8.data._M_elems[1] = local_238.data._M_elems[2];
          local_1b8.data._M_elems[2] = local_238.data._M_elems[3];
          local_1b8.data._M_elems[3] = local_238.data._M_elems[4];
          local_1b8.data._M_elems[4] = local_238.data._M_elems[5];
          local_1b8.data._M_elems[5] = local_238.data._M_elems[6];
          local_1b8.data._M_elems[6] = local_238.data._M_elems[7];
          local_1b8.data._M_elems[7] = local_238.data._M_elems[8];
          local_1b8.data._M_elems[8] = local_238.data._M_elems[9];
          bVar34 = (local_238.fpclass != 0 || local_238.data._M_elems[0] != 0) ^ local_238.neg;
          pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(local_290->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar30);
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.data._M_elems._0_16_ = ZEXT816(0);
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.exp = 0;
          local_2c8.neg = false;
          pcVar33 = (cpp_dec_float<50U,_int,_void> *)local_1f8;
          if (pcVar28 != &local_2c8) {
            local_2c8.data._M_elems._32_5_ = SUB85(local_1d8._0_8_,0);
            local_2c8.data._M_elems[9]._1_3_ = SUB83(local_1d8._0_8_,5);
            local_2c8.data._M_elems[4] = local_1e8[0];
            local_2c8.data._M_elems[5] = local_1e8[1];
            local_2c8.data._M_elems._24_5_ = stack0xfffffffffffffe20;
            local_2c8.data._M_elems[7]._1_3_ = uStack_1db;
            local_2c8.data._M_elems[0] = local_1f8._0_4_;
            local_2c8.data._M_elems[1] = local_1f8._4_4_;
            local_2c8.data._M_elems[2] = local_1f8._8_4_;
            local_2c8.data._M_elems[3] = local_1f8._12_4_;
            local_2c8.exp = local_1d8[2];
            local_2c8.neg = local_1cc;
            local_2c8.fpclass = (undefined4)local_1c8;
            local_2c8.prec_elem = local_1c8._4_4_;
            pcVar33 = pcVar28;
          }
          local_178._0_4_ = local_238.fpclass;
          local_178._4_4_ = local_238.prec_elem;
          uStack_170 = 0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_2c8,pcVar33);
          local_308.data._M_elems[0] = uVar10;
          local_308.data._M_elems[1] = local_1b8.data._M_elems[0];
          local_308.data._M_elems[2] = local_1b8.data._M_elems[1];
          local_308.data._M_elems[3] = local_1b8.data._M_elems[2];
          local_308.data._M_elems[4] = local_1b8.data._M_elems[3];
          local_308.data._M_elems[5] = local_1b8.data._M_elems[4];
          local_308.data._M_elems[6] = local_1b8.data._M_elems[5];
          local_308.data._M_elems[7] = local_1b8.data._M_elems[6];
          local_308.data._M_elems[8] = local_1b8.data._M_elems[7];
          local_308.data._M_elems[9] = local_1b8.data._M_elems[8];
          local_308.exp = iVar26;
          local_308.fpclass = (int)local_178;
          local_308.prec_elem = local_178._4_4_;
          local_308.neg = (bool)bVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,&local_2c8);
          pnVar27 = (this->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30);
          *puVar1 = CONCAT44(local_308.data._M_elems[1],local_308.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[3],local_308.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x10);
          *puVar1 = CONCAT44(local_308.data._M_elems[5],local_308.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[7],local_308.data._M_elems[6]);
          *(ulong *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x20) =
               CONCAT44(local_308.data._M_elems[9],local_308.data._M_elems[8]);
          *(int *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x28) = local_308.exp;
          *(bool *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x2c) = local_308.neg;
          *(undefined8 *)((long)&pnVar27[-1].m_backend.data + lVar30 + 0x30) = local_308._48_8_;
          bVar24 = false;
        }
        (this->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).colUp.data[local_2d0 + -1] = bVar24;
        lVar29 = local_2d0 + -1;
        base = local_290;
        lVar30 = lVar30 + -0x38;
      } while (lVar29 != 0);
    }
    local_2d0 = (long)(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
    if (local_2d0 != 0) {
      do {
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[local_2d0 + -1].idx;
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.exp = 0;
        local_308.neg = false;
        lVar29 = (long)(pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (lVar29 < 1) {
          local_278.fpclass = cpp_dec_float_finite;
          local_278.prec_elem = 10;
          local_278.neg = false;
          local_278.exp = 0;
        }
        else {
          uVar31 = lVar29 + 1;
          lVar29 = lVar29 * 0x3c;
          do {
            pNVar5 = (pIVar4->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar32 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&pNVar5[-1].val.m_backend.data + lVar29);
            pcVar28 = &(this->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
            local_2c8.fpclass = cpp_dec_float_finite;
            local_2c8.prec_elem = 10;
            local_2c8.data._M_elems[0] = 0;
            local_2c8.data._M_elems[1] = 0;
            local_2c8.data._M_elems[2] = 0;
            local_2c8.data._M_elems[3] = 0;
            local_2c8.data._M_elems[4] = 0;
            local_2c8.data._M_elems[5] = 0;
            local_2c8.data._M_elems._24_5_ = 0;
            local_2c8.data._M_elems[7]._1_3_ = 0;
            local_2c8.data._M_elems._32_5_ = 0;
            local_2c8.data._M_elems[9]._1_3_ = 0;
            local_2c8.exp = 0;
            local_2c8.neg = false;
            pcVar33 = pcVar28;
            if ((pcVar32 != &local_2c8) && (pcVar33 = pcVar32, &local_2c8 != pcVar28)) {
              uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
              local_2c8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_2c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar28->data)._M_elems;
              local_2c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
              local_2c8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_2c8.exp = pcVar28->exp;
              local_2c8.neg = pcVar28->neg;
              local_2c8.fpclass = pcVar28->fpclass;
              local_2c8.prec_elem = pcVar28->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2c8,pcVar33);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_308,&local_2c8);
            uVar31 = uVar31 - 1;
            lVar29 = lVar29 + -0x3c;
          } while (1 < uVar31);
          local_278.exp = local_308.exp;
          local_278.fpclass = local_308.fpclass;
          local_278.prec_elem = local_308.prec_elem;
          local_278.neg = local_308.neg;
        }
        uVar19 = local_308.data._M_elems[9];
        uVar18 = local_308.data._M_elems[8];
        uVar17 = local_308.data._M_elems[7];
        uVar16 = local_308.data._M_elems[6];
        uVar15 = local_308.data._M_elems[5];
        uVar14 = local_308.data._M_elems[4];
        uVar13 = local_308.data._M_elems[3];
        uVar12 = local_308.data._M_elems[2];
        uVar11 = local_308.data._M_elems[1];
        uVar10 = local_308.data._M_elems[0];
        lVar29 = local_2d0 + -1;
        local_278.data._M_elems[8] = local_308.data._M_elems[8];
        local_278.data._M_elems[9] = local_308.data._M_elems[9];
        local_278.data._M_elems[4] = local_308.data._M_elems[4];
        local_278.data._M_elems[5] = local_308.data._M_elems[5];
        local_278.data._M_elems[6] = local_308.data._M_elems[6];
        local_278.data._M_elems[7] = local_308.data._M_elems[7];
        local_278.data._M_elems[0] = local_308.data._M_elems[0];
        local_278.data._M_elems[1] = local_308.data._M_elems[1];
        local_278.data._M_elems[2] = local_308.data._M_elems[2];
        local_278.data._M_elems[3] = local_308.data._M_elems[3];
        pcVar33 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar29].m_backend;
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.exp = 0;
        local_308.neg = false;
        if (&local_308 == pcVar33) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,&local_278);
          if (local_308.data._M_elems[0] == 0 && local_308.fpclass == cpp_dec_float_finite) {
            local_238.neg = local_308.neg;
            local_238.fpclass = cpp_dec_float_finite;
          }
          else {
            local_238.neg = (bool)(local_308.neg ^ 1);
            local_238.fpclass = local_308.fpclass;
          }
        }
        else {
          local_308.prec_elem = local_278.prec_elem;
          local_308.fpclass = local_278.fpclass;
          local_308.data._M_elems[0] = uVar10;
          local_308.data._M_elems[1] = uVar11;
          local_308.data._M_elems[2] = uVar12;
          local_308.data._M_elems[3] = uVar13;
          local_308.data._M_elems[4] = uVar14;
          local_308.data._M_elems[5] = uVar15;
          local_308.data._M_elems[6] = uVar16;
          local_308.data._M_elems[7] = uVar17;
          local_308.data._M_elems[8] = uVar18;
          local_308.data._M_elems[9] = uVar19;
          local_308.exp = local_278.exp;
          local_308.neg = local_278.neg;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,pcVar33);
          local_238.neg = local_308.neg;
          local_238.fpclass = local_308.fpclass;
        }
        local_238.data._M_elems[8] = local_308.data._M_elems[8];
        local_238.data._M_elems[9] = local_308.data._M_elems[9];
        local_238.data._M_elems[4] = local_308.data._M_elems[4];
        local_238.data._M_elems[5] = local_308.data._M_elems[5];
        local_238.data._M_elems[6] = local_308.data._M_elems[6];
        local_238.data._M_elems[7] = local_308.data._M_elems[7];
        local_238.data._M_elems[0] = local_308.data._M_elems[0];
        local_238.data._M_elems[1] = local_308.data._M_elems[1];
        local_238.data._M_elems[2] = local_308.data._M_elems[2];
        local_238.data._M_elems[3] = local_308.data._M_elems[3];
        local_238.exp = local_308.exp;
        local_238.prec_elem = local_308.prec_elem;
        pnVar27 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar29;
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.exp = 0;
        local_308.neg = false;
        if (&local_308 != &pnVar27->m_backend) {
          uVar3 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x20);
          local_308.data._M_elems[8] = (uint)uVar3;
          local_308.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
          uVar3 = *(undefined8 *)&(pnVar27->m_backend).data;
          uVar6 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 8);
          uVar7 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x10);
          uVar8 = *(undefined8 *)((long)&(pnVar27->m_backend).data + 0x18);
          local_308.data._M_elems[4] = (uint)uVar7;
          local_308.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_308.data._M_elems[6] = (uint)uVar8;
          local_308.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_308.data._M_elems[0] = (uint)uVar3;
          local_308.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
          local_308.data._M_elems[2] = (uint)uVar6;
          local_308.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_308.exp = (pnVar27->m_backend).exp;
          local_308.neg = (pnVar27->m_backend).neg;
          local_308.fpclass = (pnVar27->m_backend).fpclass;
          local_308.prec_elem = (pnVar27->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_308,&local_278);
        local_278.data._M_elems[0] = local_308.data._M_elems[0];
        local_278.data._M_elems[1] = local_308.data._M_elems[1];
        local_278.data._M_elems[2] = local_308.data._M_elems[2];
        local_278.data._M_elems[3] = local_308.data._M_elems[3];
        local_278.data._M_elems[4] = local_308.data._M_elems[4];
        local_278.data._M_elems[5] = local_308.data._M_elems[5];
        local_278.data._M_elems[6] = local_308.data._M_elems[6];
        local_278.data._M_elems[7] = local_308.data._M_elems[7];
        local_278.data._M_elems[8] = local_308.data._M_elems[8];
        local_278.data._M_elems[9] = local_308.data._M_elems[9];
        local_278.exp = local_308.exp;
        local_278.neg = local_308.neg;
        local_278.fpclass = local_308.fpclass;
        local_278.prec_elem = local_308.prec_elem;
        local_2d0 = lVar29;
        local_178 = lVar29 * 0x38;
        if ((local_308.fpclass == cpp_dec_float_NaN || local_238.fpclass == cpp_dec_float_NaN) ||
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_238,&local_278), uVar3 = local_238._48_8_,
           uVar10 = local_238.data._M_elems[0], -1 < iVar26)) {
          fVar21 = local_278.fpclass;
          uVar10 = local_278.data._M_elems[0];
          local_98 = CONCAT44(local_278.data._M_elems[2],local_278.data._M_elems[1]);
          uStack_90 = CONCAT44(local_278.data._M_elems[4],local_278.data._M_elems[3]);
          local_88 = CONCAT44(local_278.data._M_elems[6],local_278.data._M_elems[5]);
          uStack_80 = CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
          local_78 = local_278.data._M_elems[9];
          bVar34 = (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) ^
                   local_278.neg;
          local_118.fpclass = cpp_dec_float_finite;
          local_118.prec_elem = 10;
          local_118.data._M_elems[0] = 0;
          local_118.data._M_elems[1] = 0;
          local_118.data._M_elems[2] = 0;
          local_118.data._M_elems[3] = 0;
          local_118.data._M_elems[4] = 0;
          local_118.data._M_elems[5] = 0;
          local_118.data._M_elems._24_5_ = 0;
          local_118.data._M_elems[7]._1_3_ = 0;
          local_118.data._M_elems._32_5_ = 0;
          local_118.data._M_elems[9]._1_3_ = 0;
          local_118.exp = 0;
          local_118.neg = false;
          local_27c = local_278.exp;
          local_15c = local_278.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_308,
                     (long)(pIVar4->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          auVar23 = (undefined1  [16])local_158.data._M_elems._0_16_;
          local_118.data._M_elems._32_5_ = local_158.data._M_elems._32_5_;
          local_118.data._M_elems[9]._1_3_ = local_158.data._M_elems[9]._1_3_;
          local_118.data._M_elems[4] = local_158.data._M_elems[4];
          local_118.data._M_elems[5] = local_158.data._M_elems[5];
          local_118.data._M_elems._24_5_ = local_158.data._M_elems._24_5_;
          local_118.data._M_elems[7]._1_3_ = local_158.data._M_elems[7]._1_3_;
          local_118.data._M_elems[0] = local_158.data._M_elems[0];
          local_118.data._M_elems[1] = local_158.data._M_elems[1];
          local_118.data._M_elems[2] = local_158.data._M_elems[2];
          local_118.data._M_elems[3] = local_158.data._M_elems[3];
          local_118.exp = local_158.exp;
          local_118.neg = local_158.neg;
          local_118.fpclass = local_158.fpclass;
          local_118.prec_elem = local_158.prec_elem;
          local_158.data._M_elems._0_16_ = auVar23;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_118,&local_308);
          local_1b8.data._M_elems[0] = uVar10;
          local_1b8.data._M_elems[9] = local_78;
          local_1b8.data._M_elems[5] = (uint)local_88;
          local_1b8.data._M_elems[6] = (uint)((ulong)local_88 >> 0x20);
          local_1b8.data._M_elems[7] = (uint)uStack_80;
          local_1b8.data._M_elems[8] = (uint)((ulong)uStack_80 >> 0x20);
          local_1b8.data._M_elems[1] = (uint)local_98;
          local_1b8.data._M_elems[2] = (uint)((ulong)local_98 >> 0x20);
          local_1b8.data._M_elems[3] = (uint)uStack_90;
          local_1b8.data._M_elems[4] = (uint)((ulong)uStack_90 >> 0x20);
          local_1b8.exp = local_27c;
          local_1b8.prec_elem = local_15c;
          local_1b8.fpclass = fVar21;
          local_1b8.neg = (bool)bVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1b8,&local_118);
          this = local_288;
          base = local_290;
          local_308.fpclass = cpp_dec_float_finite;
          local_308.prec_elem = 10;
          local_308.data._M_elems[0] = 0;
          local_308.data._M_elems[1] = 0;
          local_308.data._M_elems[2] = 0;
          local_308.data._M_elems[3] = 0;
          local_308.data._M_elems[4] = 0;
          local_308.data._M_elems[5] = 0;
          local_308.data._M_elems[6] = 0;
          local_308.data._M_elems[7] = 0;
          local_308.data._M_elems[8] = 0;
          local_308.data._M_elems[9] = 0;
          local_308.exp = 0;
          local_308.neg = false;
          lVar29 = (long)(pIVar4->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar29) {
            uVar31 = lVar29 + 1;
            lVar29 = lVar29 * 0x3c;
            do {
              pNVar5 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar32 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&pNVar5[-1].val.m_backend.data + lVar29);
              pcVar28 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.data._M_elems[0] = 0;
              local_2c8.data._M_elems[1] = 0;
              local_2c8.data._M_elems[2] = 0;
              local_2c8.data._M_elems[3] = 0;
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.exp = 0;
              local_2c8.neg = false;
              pcVar33 = pcVar28;
              if ((pcVar32 != &local_2c8) && (pcVar33 = pcVar32, &local_2c8 != pcVar28)) {
                uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
                local_2c8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_2c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar28->data)._M_elems;
                local_2c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
                local_2c8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_2c8.exp = pcVar28->exp;
                local_2c8.neg = pcVar28->neg;
                local_2c8.fpclass = pcVar28->fpclass;
                local_2c8.prec_elem = pcVar28->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_2c8,pcVar33);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_308,&local_2c8);
              uVar31 = uVar31 - 1;
              lVar29 = lVar29 + -0x3c;
            } while (1 < uVar31);
          }
          local_68.data._M_elems[9] = local_308.data._M_elems[9];
          local_68.data._M_elems[8] = local_308.data._M_elems[8];
          local_68.data._M_elems[1] = local_308.data._M_elems[1];
          local_68.data._M_elems[0] = local_308.data._M_elems[0];
          local_68.data._M_elems[3] = local_308.data._M_elems[3];
          local_68.data._M_elems[2] = local_308.data._M_elems[2];
          local_68.data._M_elems[5] = local_308.data._M_elems[5];
          local_68.data._M_elems[4] = local_308.data._M_elems[4];
          local_68.data._M_elems[7] = local_308.data._M_elems[7];
          local_68.data._M_elems[6] = local_308.data._M_elems[6];
          local_2c8.data._M_elems[0] = local_1f8._0_4_;
          local_2c8.data._M_elems[1] = local_1f8._4_4_;
          local_2c8.data._M_elems[2] = local_1f8._8_4_;
          local_2c8.data._M_elems[3] = local_1f8._12_4_;
          local_2c8.data._M_elems[4] = local_1e8[0];
          local_2c8.data._M_elems[5] = local_1e8[1];
          local_2c8.data._M_elems._24_5_ = stack0xfffffffffffffe20;
          local_2c8.data._M_elems[7]._1_3_ = uStack_1db;
          local_2c8.data._M_elems._32_5_ = SUB85(local_1d8._0_8_,0);
          local_2c8.data._M_elems[9]._1_3_ = SUB83(local_1d8._0_8_,5);
          local_2c8.exp = local_1d8[2];
          local_2c8.neg = local_1cc;
          local_2c8.fpclass = (undefined4)local_1c8;
          local_2c8.prec_elem = local_1c8._4_4_;
          local_68.exp = local_308.exp;
          local_68.neg = local_308.neg;
          local_68._48_8_ = local_308._48_8_;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_2c8,&local_68);
          local_308.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_308.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_308.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_308.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_308.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_308.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_308.data._M_elems[6] = local_1b8.data._M_elems[6];
          local_308.data._M_elems[7] = local_1b8.data._M_elems[7];
          local_308.data._M_elems[8] = local_1b8.data._M_elems[8];
          local_308.data._M_elems[9] = local_1b8.data._M_elems[9];
          local_308.exp = local_1b8.exp;
          local_308.neg = local_1b8.neg;
          local_308.fpclass = local_1b8.fpclass;
          local_308.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_308,&local_2c8);
          pnVar27 = (this->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).rowWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&(pnVar27->m_backend).data + local_178);
          *puVar1 = CONCAT44(local_308.data._M_elems[1],local_308.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[3],local_308.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&(pnVar27->m_backend).data + local_178 + 0x10);
          *puVar1 = CONCAT44(local_308.data._M_elems[5],local_308.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[7],local_308.data._M_elems[6]);
          *(ulong *)((long)&(pnVar27->m_backend).data + local_178 + 0x20) =
               CONCAT44(local_308.data._M_elems[9],local_308.data._M_elems[8]);
          *(int *)((long)&(pnVar27->m_backend).data + local_178 + 0x28) = local_308.exp;
          *(bool *)((long)&(pnVar27->m_backend).data + local_178 + 0x2c) = local_308.neg;
          *(undefined8 *)((long)&(pnVar27->m_backend).data + local_178 + 0x30) = local_308._48_8_;
          bVar24 = true;
        }
        else {
          local_27c = local_238.exp;
          local_98 = CONCAT44(local_238.data._M_elems[2],local_238.data._M_elems[1]);
          uStack_90 = CONCAT44(local_238.data._M_elems[4],local_238.data._M_elems[3]);
          local_88 = CONCAT44(local_238.data._M_elems[6],local_238.data._M_elems[5]);
          uStack_80 = CONCAT44(local_238.data._M_elems[8],local_238.data._M_elems[7]);
          local_78 = local_238.data._M_elems[9];
          local_118.fpclass = cpp_dec_float_finite;
          local_118.prec_elem = 10;
          local_118.data._M_elems[0] = 0;
          local_118.data._M_elems[1] = 0;
          local_118.data._M_elems[2] = 0;
          local_118.data._M_elems[3] = 0;
          local_118.data._M_elems[4] = 0;
          local_118.data._M_elems[5] = 0;
          local_118.data._M_elems._24_5_ = 0;
          local_118.data._M_elems[7]._1_3_ = 0;
          local_118.data._M_elems._32_5_ = 0;
          local_118.data._M_elems[9]._1_3_ = 0;
          local_118.exp = 0;
          local_118.neg = false;
          bVar34 = (local_238.data._M_elems[0] != 0 || local_238.fpclass != 0) ^ local_238.neg;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_308,
                     (long)(pIVar4->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          auVar23 = (undefined1  [16])local_158.data._M_elems._0_16_;
          local_118.data._M_elems._32_5_ = local_158.data._M_elems._32_5_;
          local_118.data._M_elems[9]._1_3_ = local_158.data._M_elems[9]._1_3_;
          local_118.data._M_elems[4] = local_158.data._M_elems[4];
          local_118.data._M_elems[5] = local_158.data._M_elems[5];
          local_118.data._M_elems._24_5_ = local_158.data._M_elems._24_5_;
          local_118.data._M_elems[7]._1_3_ = local_158.data._M_elems[7]._1_3_;
          local_118.data._M_elems[0] = local_158.data._M_elems[0];
          local_118.data._M_elems[1] = local_158.data._M_elems[1];
          local_118.data._M_elems[2] = local_158.data._M_elems[2];
          local_118.data._M_elems[3] = local_158.data._M_elems[3];
          local_118.exp = local_158.exp;
          local_118.neg = local_158.neg;
          local_118.fpclass = local_158.fpclass;
          local_118.prec_elem = local_158.prec_elem;
          local_158.data._M_elems._0_16_ = auVar23;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_118,&local_308);
          uVar6 = local_238._48_8_;
          local_1b8.data._M_elems[0] = uVar10;
          local_1b8.data._M_elems[9] = local_78;
          local_1b8.data._M_elems[5] = (uint)local_88;
          local_1b8.data._M_elems[6] = (uint)((ulong)local_88 >> 0x20);
          local_1b8.data._M_elems[7] = (uint)uStack_80;
          local_1b8.data._M_elems[8] = (uint)((ulong)uStack_80 >> 0x20);
          local_1b8.data._M_elems[1] = (uint)local_98;
          local_1b8.data._M_elems[2] = (uint)((ulong)local_98 >> 0x20);
          local_1b8.data._M_elems[3] = (uint)uStack_90;
          local_1b8.data._M_elems[4] = (uint)((ulong)uStack_90 >> 0x20);
          local_1b8.exp = local_27c;
          local_238.fpclass = (fpclass_type)uVar3;
          local_238.prec_elem = SUB84(uVar3,4);
          local_1b8.fpclass = local_238.fpclass;
          local_1b8.prec_elem = local_238.prec_elem;
          local_238._48_8_ = uVar6;
          local_1b8.neg = (bool)bVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1b8,&local_118);
          this = local_288;
          base = local_290;
          local_308.fpclass = cpp_dec_float_finite;
          local_308.prec_elem = 10;
          local_308.data._M_elems[0] = 0;
          local_308.data._M_elems[1] = 0;
          local_308.data._M_elems[2] = 0;
          local_308.data._M_elems[3] = 0;
          local_308.data._M_elems[4] = 0;
          local_308.data._M_elems[5] = 0;
          local_308.data._M_elems[6] = 0;
          local_308.data._M_elems[7] = 0;
          local_308.data._M_elems[8] = 0;
          local_308.data._M_elems[9] = 0;
          local_308.exp = 0;
          local_308.neg = false;
          lVar29 = (long)(pIVar4->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar29) {
            uVar31 = lVar29 + 1;
            lVar29 = lVar29 * 0x3c;
            do {
              pNVar5 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar32 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&pNVar5[-1].val.m_backend.data + lVar29);
              pcVar28 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.data._M_elems[0] = 0;
              local_2c8.data._M_elems[1] = 0;
              local_2c8.data._M_elems[2] = 0;
              local_2c8.data._M_elems[3] = 0;
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.exp = 0;
              local_2c8.neg = false;
              pcVar33 = pcVar28;
              if ((pcVar32 != &local_2c8) && (pcVar33 = pcVar32, &local_2c8 != pcVar28)) {
                uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
                local_2c8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_2c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar28->data)._M_elems;
                local_2c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
                local_2c8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_2c8.exp = pcVar28->exp;
                local_2c8.neg = pcVar28->neg;
                local_2c8.fpclass = pcVar28->fpclass;
                local_2c8.prec_elem = pcVar28->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_2c8,pcVar33);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_308,&local_2c8);
              uVar31 = uVar31 - 1;
              lVar29 = lVar29 + -0x3c;
            } while (1 < uVar31);
          }
          local_68.data._M_elems[9] = local_308.data._M_elems[9];
          local_68.data._M_elems[8] = local_308.data._M_elems[8];
          local_68.data._M_elems[1] = local_308.data._M_elems[1];
          local_68.data._M_elems[0] = local_308.data._M_elems[0];
          local_68.data._M_elems[3] = local_308.data._M_elems[3];
          local_68.data._M_elems[2] = local_308.data._M_elems[2];
          local_68.data._M_elems[5] = local_308.data._M_elems[5];
          local_68.data._M_elems[4] = local_308.data._M_elems[4];
          local_68.data._M_elems[7] = local_308.data._M_elems[7];
          local_68.data._M_elems[6] = local_308.data._M_elems[6];
          local_2c8.data._M_elems[0] = local_1f8._0_4_;
          local_2c8.data._M_elems[1] = local_1f8._4_4_;
          local_2c8.data._M_elems[2] = local_1f8._8_4_;
          local_2c8.data._M_elems[3] = local_1f8._12_4_;
          local_2c8.data._M_elems[4] = local_1e8[0];
          local_2c8.data._M_elems[5] = local_1e8[1];
          local_2c8.data._M_elems._24_5_ = stack0xfffffffffffffe20;
          local_2c8.data._M_elems[7]._1_3_ = uStack_1db;
          local_2c8.data._M_elems._32_5_ = SUB85(local_1d8._0_8_,0);
          local_2c8.data._M_elems[9]._1_3_ = SUB83(local_1d8._0_8_,5);
          local_2c8.exp = local_1d8[2];
          local_2c8.neg = local_1cc;
          local_2c8.fpclass = (undefined4)local_1c8;
          local_2c8.prec_elem = local_1c8._4_4_;
          local_68.exp = local_308.exp;
          local_68.neg = local_308.neg;
          local_68._48_8_ = local_308._48_8_;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_2c8,&local_68);
          local_308.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_308.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_308.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_308.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_308.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_308.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_308.data._M_elems[6] = local_1b8.data._M_elems[6];
          local_308.data._M_elems[7] = local_1b8.data._M_elems[7];
          local_308.data._M_elems[8] = local_1b8.data._M_elems[8];
          local_308.data._M_elems[9] = local_1b8.data._M_elems[9];
          local_308.exp = local_1b8.exp;
          local_308.neg = local_1b8.neg;
          local_308.fpclass = local_1b8.fpclass;
          local_308.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_308,&local_2c8);
          pnVar27 = (this->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).rowWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&(pnVar27->m_backend).data + local_178);
          *puVar1 = CONCAT44(local_308.data._M_elems[1],local_308.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[3],local_308.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&(pnVar27->m_backend).data + local_178 + 0x10);
          *puVar1 = CONCAT44(local_308.data._M_elems[5],local_308.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_308.data._M_elems[7],local_308.data._M_elems[6]);
          *(ulong *)((long)&(pnVar27->m_backend).data + local_178 + 0x20) =
               CONCAT44(local_308.data._M_elems[9],local_308.data._M_elems[8]);
          *(int *)((long)&(pnVar27->m_backend).data + local_178 + 0x28) = local_308.exp;
          *(bool *)((long)&(pnVar27->m_backend).data + local_178 + 0x2c) = local_308.neg;
          *(undefined8 *)((long)&(pnVar27->m_backend).data + local_178 + 0x30) = local_308._48_8_;
          bVar24 = false;
        }
        (this->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).rowRight.data[local_2d0] = bVar24;
      } while (local_2d0 != 0);
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}